

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  uchar uVar1;
  bool bVar2;
  uchar *puVar3;
  _Bool _Var4;
  CURLUcode CVar5;
  int iVar6;
  Curl_handler *pCVar7;
  Curl_URL *pCVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  Curl_URL *pCVar12;
  char cVar13;
  char cVar14;
  long lVar15;
  long lVar16;
  byte bVar17;
  char *oldurl;
  byte local_50;
  CURLU *local_48;
  char *local_38;
  
  bVar17 = 0;
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      goto switchD_00439f31_caseD_0;
    case CURLUPART_SCHEME:
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u = (CURLU *)&u->fragment;
      break;
    default:
      goto LAB_0043a33f;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  cVar14 = (char)flags;
  switch(what) {
  case CURLUPART_URL:
    _Var4 = Curl_is_absolute_url(part,(char *)0x0,8);
    if ((!_Var4) && (CVar5 = curl_url_get(u,CURLUPART_URL,&local_38,flags), CVar5 == CURLUE_OK)) {
      pCVar8 = (Curl_URL *)Curl_concat_url(local_38,part);
      (*Curl_cfree)(local_38);
      CVar5 = CURLUE_OUT_OF_MEMORY;
      if (pCVar8 == (Curl_URL *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      pCVar12 = (Curl_URL *)(*Curl_ccalloc)(0x58,1);
      if (pCVar12 != (Curl_URL *)0x0) {
        CVar5 = parseurl((char *)pCVar8,pCVar12,flags);
        (*Curl_cfree)(pCVar8);
        if (CVar5 == CURLUE_OK) {
          free_urlhandle(u);
          pCVar8 = pCVar12;
          for (lVar15 = 0xb; lVar15 != 0; lVar15 = lVar15 + -1) {
            u->scheme = pCVar8->scheme;
            pCVar8 = (Curl_URL *)((long)pCVar8 + (ulong)bVar17 * -0x10 + 8);
            u = (CURLU *)((long)u + (ulong)bVar17 * -0x10 + 8);
          }
          (*Curl_cfree)(pCVar12);
          return CURLUE_OK;
        }
        free_urlhandle(pCVar12);
        pCVar8 = pCVar12;
      }
      (*Curl_cfree)(pCVar8);
      return CVar5;
    }
    pCVar8 = (Curl_URL *)(*Curl_ccalloc)(0x58,1);
    if (pCVar8 == (Curl_URL *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    CVar5 = parseurl(part,pCVar8,flags);
    if (CVar5 == CURLUE_OK) {
      free_urlhandle(u);
      pCVar12 = pCVar8;
      for (lVar15 = 0xb; lVar15 != 0; lVar15 = lVar15 + -1) {
        u->scheme = pCVar12->scheme;
        pCVar12 = (Curl_URL *)((long)pCVar12 + (ulong)bVar17 * -0x10 + 8);
        u = (CURLU *)((long)u + (ulong)bVar17 * -0x10 + 8);
      }
      (*Curl_cfree)(pCVar8);
      return CURLUE_OK;
    }
    free_urlhandle(pCVar8);
    goto LAB_0043a304;
  case CURLUPART_SCHEME:
    if (((flags & 8) == 0) && (pCVar7 = Curl_builtin_scheme(part), pCVar7 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    lVar15 = 0;
    local_48 = u;
    goto LAB_0043a107;
  case CURLUPART_USER:
    local_48 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_48 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_48 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    local_48 = (CURLU *)&u->host;
    break;
  case CURLUPART_PORT:
    lVar15 = strtol(part,(char **)0x0,10);
    if (lVar15 - 0x10000U < 0xffffffffffff0001) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    local_48 = (CURLU *)&u->port;
LAB_0043a107:
    local_50 = 0;
    goto LAB_0043a130;
  case CURLUPART_PATH:
    local_48 = (CURLU *)&u->path;
    local_50 = 0;
    lVar15 = 1;
    if (cVar14 < '\0') {
      bVar2 = false;
      goto LAB_00439fc4;
    }
    goto LAB_00439fb1;
  case CURLUPART_QUERY:
    local_50 = (byte)(flags >> 8) & 1;
    local_48 = (CURLU *)&u->query;
    lVar15 = 0;
    if (cVar14 < '\0') {
      bVar2 = true;
      goto LAB_00439fc4;
    }
    goto LAB_0043a130;
  case CURLUPART_FRAGMENT:
    local_48 = (CURLU *)&u->fragment;
    break;
  default:
LAB_0043a33f:
    return CURLUE_UNKNOWN_PART;
  }
  local_50 = 0;
  if (cVar14 < '\0') {
    bVar2 = false;
    lVar15 = 0;
LAB_00439fc4:
    sVar9 = strlen(part);
    pCVar8 = (Curl_URL *)(*Curl_cmalloc)(sVar9 * 3 + 1);
    CVar5 = CURLUE_OUT_OF_MEMORY;
    if (pCVar8 == (Curl_URL *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    if (bVar2) {
      lVar16 = 0;
      while( true ) {
        cVar14 = part[lVar16];
        cVar13 = '+';
        if ((cVar14 != ' ') && (cVar13 = cVar14, cVar14 == '\0')) break;
        *(char *)((long)&pCVar8->scheme + lVar16) = cVar13;
        lVar16 = lVar16 + 1;
      }
      *(undefined1 *)((long)&pCVar8->scheme + lVar16) = 0;
      part = (*Curl_cstrdup)((char *)pCVar8);
      if ((uchar *)part == (uchar *)0x0) {
LAB_0043a304:
        (*Curl_cfree)(pCVar8);
        return CVar5;
      }
    }
    uVar1 = *part;
    pCVar12 = pCVar8;
    puVar3 = (uchar *)part;
    while (uVar1 != '\0') {
      _Var4 = Curl_isunreserved(uVar1);
      uVar1 = *puVar3;
      if (_Var4) {
LAB_0043a054:
        *(uchar *)&pCVar12->scheme = uVar1;
        lVar16 = 1;
      }
      else {
        if ((((bool)(bVar2 & uVar1 == '+')) || ((uVar1 == '/' & (byte)lVar15) != 0)) ||
           ((uVar1 == '=' & local_50) != 0)) goto LAB_0043a054;
        curl_msnprintf((char *)pCVar12,4,"%%%02x",(ulong)(uint)(int)(char)uVar1);
        lVar16 = 3;
      }
      pCVar12 = (Curl_URL *)((long)&pCVar12->scheme + lVar16);
      uVar1 = puVar3[1];
      puVar3 = puVar3 + 1;
    }
    *(char *)&pCVar12->scheme = '\0';
    if (bVar2) {
      (*Curl_cfree)(part);
    }
    lVar15 = 0;
joined_r0x0043a0cf:
    if (((local_50 == 0) || (pcVar11 = u->query, pcVar11 == (char *)0x0)) ||
       (sVar9 = strlen(pcVar11), sVar9 == 0)) {
      (*Curl_cfree)(local_48->scheme);
      local_48->scheme = (char *)pCVar8;
      if (lVar15 != 0) {
        u->portnum = lVar15;
        return CURLUE_OK;
      }
      return CURLUE_OK;
    }
    cVar14 = pcVar11[sVar9 - 1];
    sVar10 = strlen((char *)pCVar8);
    lVar15 = (cVar14 != '&') + sVar9;
    pcVar11 = (char *)(*Curl_cmalloc)(sVar10 + lVar15 + 1);
    if (pcVar11 != (char *)0x0) {
      strcpy(pcVar11,u->query);
      if (cVar14 != '&') {
        pcVar11[sVar9] = '&';
      }
      strcpy(pcVar11 + lVar15,(char *)pCVar8);
      (*Curl_cfree)(pCVar8);
      (*Curl_cfree)(local_48->scheme);
      local_48->scheme = pcVar11;
switchD_00439f31_caseD_0:
      return CURLUE_OK;
    }
    (*Curl_cfree)(pCVar8);
  }
  else {
LAB_00439fb1:
    local_50 = 0;
    lVar15 = 0;
LAB_0043a130:
    pCVar8 = (Curl_URL *)(*Curl_cstrdup)(part);
    pCVar12 = pCVar8;
    if (pCVar8 != (Curl_URL *)0x0) {
      do {
        lVar16 = 1;
        if (*(char *)&pCVar12->scheme == '%') {
          iVar6 = Curl_isxdigit((uint)*(byte *)((long)&pCVar12->scheme + 1));
          if (((iVar6 != 0) &&
              (iVar6 = Curl_isxdigit((uint)*(byte *)((long)&pCVar12->scheme + 2)), iVar6 != 0)) &&
             ((iVar6 = Curl_isupper((uint)*(byte *)((long)&pCVar12->scheme + 1)), iVar6 != 0 ||
              (iVar6 = Curl_isupper((uint)*(byte *)((long)&pCVar12->scheme + 2)), iVar6 != 0)))) {
            iVar6 = tolower((uint)*(byte *)((long)&pCVar12->scheme + 1));
            *(char *)((long)&pCVar12->scheme + 1) = (char)iVar6;
            iVar6 = tolower((uint)*(byte *)((long)&pCVar12->scheme + 2));
            *(char *)((long)&pCVar12->scheme + 2) = (char)iVar6;
            lVar16 = 3;
          }
        }
        else if (*(char *)&pCVar12->scheme == '\0') goto joined_r0x0043a0cf;
        pCVar12 = (Curl_URL *)((long)&pCVar12->scheme + lVar16);
      } while( true );
    }
  }
  return CURLUE_OUT_OF_MEMORY;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_PORT:
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      free(*storep);
      *storep = NULL;
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    break;
  case CURLUPART_PORT:
    urlencode = FALSE; /* never */
    port = strtol(part, NULL, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    storep = &u->port;
    break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;
    CURLU *handle2;

    if(Curl_is_absolute_url(part, NULL, MAX_SCHEME_LEN)) {
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }
    /* extract the full "old" URL to do the redirect on */
    result = curl_url_get(u, CURLUPART_URL, &oldurl, flags);
    if(result) {
      /* couldn't get the old URL, just use the new! */
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }

    /* apply the relative part to create a new URL */
    redired_url = Curl_concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    /* now parse the new URL */
    handle2 = curl_url();
    if(!handle2) {
      free(redired_url);
      return CURLUE_OUT_OF_MEMORY;
    }
    result = parseurl(redired_url, handle2, flags);
    free(redired_url);
    if(!result)
      mv_urlhandle(handle2, u);
    else
      curl_url_cleanup(handle2);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  if(storep) {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(urlencode) {
      const char *i;
      char *o;
      bool free_part = FALSE;
      char *enc = malloc(nalloc * 3 + 1); /* for worst case! */
      if(!enc)
        return CURLUE_OUT_OF_MEMORY;
      if(plusencode) {
        /* space to plus */
        i = part;
        for(o = enc; *i; ++o, ++i)
          *o = (*i == ' ') ? '+' : *i;
        *o = 0; /* zero terminate */
        part = strdup(enc);
        if(!part) {
          free(enc);
          return CURLUE_OUT_OF_MEMORY;
        }
        free_part = TRUE;
      }
      for(i = part, o = enc; *i; i++) {
        if(Curl_isunreserved(*i) ||
           ((*i == '/') && urlskipslash) ||
           ((*i == '=') && appendquery) ||
           ((*i == '+') && plusencode)) {
          *o = *i;
          o++;
        }
        else {
          snprintf(o, 4, "%%%02x", *i);
          o += 3;
        }
      }
      *o = 0; /* zero terminate */
      newp = enc;
      if(free_part)
        free((char *)part);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = (char)TOLOWER(p[1]);
          p[2] = (char)TOLOWER(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the string onto the old query. Add a '&' separator if none is
         present at the end of the exsting query already */
      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        size_t newplen = strlen(newp);
        char *p = malloc(querylen + addamperand + newplen + 1);
        if(!p) {
          free((char *)newp);
          return CURLUE_OUT_OF_MEMORY;
        }
        strcpy(p, u->query); /* original query */
        if(addamperand)
          p[querylen] = '&'; /* ampersand */
        strcpy(&p[querylen + addamperand], newp); /* new suffix */
        free((char *)newp);
        free(*storep);
        *storep = p;
        return CURLUE_OK;
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}